

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
SharedPtrTests_self_Self1_Test::SharedPtrTests_self_Self1_Test(SharedPtrTests_self_Self1_Test *this)

{
  SharedPtrTests_self_Self1_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__SharedPtrTests_self_Self1_Test_0016ed48;
  return;
}

Assistant:

TEST(SharedPtrTests_self, Self1) {
	int* a;
	a = new int;
	*a = 4;
	SharedPtr<int> t1(a);
	SharedPtr<int> t2;
	t2 = t1;
	t2 = t2;
	EXPECT_EQ(t2.use_count(), 2);
	EXPECT_EQ(t1.use_count(), 2);
	EXPECT_EQ(t2.get(), t1.get());
}